

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

bool __thiscall
libmatroska::KaxBlockGroup::AddFrame
          (KaxBlockGroup *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          KaxBlockGroup *PastBlock,KaxBlockGroup *ForwBlock,LacingType lacing)

{
  KaxCluster *this_00;
  bool bVar1;
  KaxInternalBlock *this_01;
  uint64 uVar2;
  KaxReferenceBlock *pKVar3;
  
  this_01 = (KaxInternalBlock *)
            libebml::EbmlMaster::FindFirstElt
                      (&this->super_EbmlMaster,(EbmlCallbacks *)KaxBlock::ClassInfos,true);
  this_00 = this->ParentCluster;
  if (this_00 != (KaxCluster *)0x0) {
    this_01->ParentCluster = this_00;
    if (this_01->bLocalTimecodeUsed == true) {
      uVar2 = KaxCluster::GetBlockGlobalTimecode(this_00,this_01->LocalTimecode);
      this_01->Timecode = uVar2;
      this_01->bLocalTimecodeUsed = false;
    }
    this->ParentTrack = track;
    bVar1 = KaxInternalBlock::AddFrame(this_01,track,timecode,buffer,lacing,false);
    pKVar3 = (KaxReferenceBlock *)
             libebml::EbmlMaster::FindFirstElt
                       (&this->super_EbmlMaster,(EbmlCallbacks *)KaxReferenceBlock::ClassInfos,true)
    ;
    KaxReferenceBlock::SetReferencedBlock(pKVar3,PastBlock);
    pKVar3->ParentBlock = this;
    pKVar3 = (KaxReferenceBlock *)
             libebml::EbmlMaster::AddNewElt
                       (&this->super_EbmlMaster,(EbmlCallbacks *)KaxReferenceBlock::ClassInfos);
    KaxReferenceBlock::SetReferencedBlock(pKVar3,ForwBlock);
    pKVar3->ParentBlock = this;
    return bVar1;
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x2f2,
                "bool libmatroska::KaxBlockGroup::AddFrame(const KaxTrackEntry &, uint64, DataBuffer &, const KaxBlockGroup &, const KaxBlockGroup &, LacingType)"
               );
}

Assistant:

bool KaxBlockGroup::AddFrame(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, const KaxBlockGroup & PastBlock, const KaxBlockGroup & ForwBlock, LacingType lacing)
{
  //  assert(past_timecode < 0);

  //  assert(forw_timecode > 0);

  KaxBlock & theBlock = GetChild<KaxBlock>(*this);
  assert(ParentCluster != NULL);
  theBlock.SetParent(*ParentCluster);
  ParentTrack = &track;
  bool bRes = theBlock.AddFrame(track, timecode, buffer, lacing);

  KaxReferenceBlock & thePastRef = GetChild<KaxReferenceBlock>(*this);
  thePastRef.SetReferencedBlock(PastBlock);
  thePastRef.SetParentBlock(*this);

  KaxReferenceBlock & theFutureRef = AddNewChild<KaxReferenceBlock>(*this);
  theFutureRef.SetReferencedBlock(ForwBlock);
  theFutureRef.SetParentBlock(*this);

  return bRes;
}